

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util.h
# Opt level: O1

FieldDescriptor * __thiscall
google::protobuf::TestUtil::ReflectionTester::F(ReflectionTester *this,string *name)

{
  ushort uVar1;
  Descriptor *this_00;
  ushort *puVar2;
  FileDescriptor *this_01;
  int iVar3;
  FieldDescriptor *pFVar4;
  undefined8 extraout_RAX;
  void *__s1;
  size_type __rlen;
  ulong __n;
  string_view name_00;
  string_view name_01;
  string local_a0;
  Descriptor *local_80;
  FieldDescriptor *local_78;
  AlphaNum local_50;
  
  this_00 = this->base_descriptor_;
  puVar2 = (ushort *)(this_00->all_names_).payload_;
  uVar1 = *puVar2;
  __n = (ulong)uVar1;
  __s1 = (void *)((long)puVar2 + ~__n);
  if (uVar1 == 0x14) {
    iVar3 = bcmp(__s1,"TestPackedExtensions",__n);
joined_r0x006474cb:
    if (iVar3 == 0) {
      this_01 = this_00->file_;
      local_78 = (FieldDescriptor *)(name->_M_dataplus)._M_p;
      local_80 = (Descriptor *)name->_M_string_length;
      local_50.piece_._M_len = (size_t)&DAT_0000000a;
      local_50.piece_._M_str = "_extension";
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_a0,(lts_20250127 *)&local_80,&local_50,(AlphaNum *)local_80);
      name_01._M_str = local_a0._M_dataplus._M_p;
      name_01._M_len = local_a0._M_string_length;
      pFVar4 = FileDescriptor::FindExtensionByName(this_01,name_01);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00647549;
    }
  }
  else if (uVar1 == 0x11) {
    iVar3 = bcmp(__s1,"TestAllExtensions",__n);
    goto joined_r0x006474cb;
  }
  name_00._M_str = (name->_M_dataplus)._M_p;
  name_00._M_len = name->_M_string_length;
  pFVar4 = Descriptor::FindFieldByName(this_00,name_00);
LAB_00647549:
  if (pFVar4 == (FieldDescriptor *)0x0) {
    F((ReflectionTester *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  return pFVar4;
}

Assistant:

inline const FieldDescriptor* TestUtil::ReflectionTester::F(
    const std::string& name) {
  const FieldDescriptor* result = nullptr;
  if (base_descriptor_->name() == "TestAllExtensions" ||
      base_descriptor_->name() == "TestPackedExtensions") {
    result = base_descriptor_->file()->FindExtensionByName(
        absl::StrCat(name, "_extension"));
  } else {
    result = base_descriptor_->FindFieldByName(name);
  }
  ABSL_CHECK(result != nullptr);
  return result;
}